

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

MemoryLayout * Vector::getElementLayout(MemoryLayout *__return_storage_ptr__,Type *element_t)

{
  runtime_error *anon_var_0;
  Type *element_t_local;
  
  Typelib::layout_of(__return_storage_ptr__,element_t,false,false,true,true);
  return __return_storage_ptr__;
}

Assistant:

MemoryLayout Vector::getElementLayout(Type const& element_t)
{
    try {
        return Typelib::layout_of(element_t);
    }
    catch(std::runtime_error&)
    {
        return MemoryLayout();
    }
}